

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::EnumDescriptorProto::MergeFrom
          (EnumDescriptorProto *this,EnumDescriptorProto *from)

{
  uint uVar1;
  void *pvVar2;
  LogMessage *other;
  EnumOptions *this_00;
  EnumOptions *from_00;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x1861);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
            (&(this->value_).super_RepeatedPtrFieldBase,&(from->value_).super_RepeatedPtrFieldBase);
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      internal::ArenaStringPtr::AssignWithDefault
                (&this->name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
                 (from->name_).ptr_);
    }
    if ((uVar1 & 2) != 0) {
      this_00 = mutable_options(this);
      from_00 = from->options_;
      if (from_00 == (EnumOptions *)0x0) {
        from_00 = (EnumOptions *)&_EnumOptions_default_instance_;
      }
      EnumOptions::MergeFrom(this_00,from_00);
    }
  }
  return;
}

Assistant:

void EnumDescriptorProto::MergeFrom(const EnumDescriptorProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.EnumDescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  value_.MergeFrom(from.value_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 3u) {
    if (cached_has_bits & 0x00000001u) {
      set_has_name();
      name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
    }
    if (cached_has_bits & 0x00000002u) {
      mutable_options()->::google::protobuf::EnumOptions::MergeFrom(from.options());
    }
  }
}